

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool CanonicalizePath(string *path,uint64_t *slash_bits,string *err)

{
  Metrics *this;
  bool bVar1;
  int iVar2;
  Metric *pMVar3;
  pointer path_00;
  size_t len;
  ScopedMetric metrics_h_scoped;
  size_type local_68;
  string local_60;
  ScopedMetric local_40;
  
  if ((CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)::
       metrics_h_metric == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)
                                   ::metrics_h_metric), this = g_metrics, iVar2 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar3 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"canonicalize str","");
      pMVar3 = Metrics::NewMetric(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    CanonicalizePath::metrics_h_metric = pMVar3;
    __cxa_guard_release(&CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,CanonicalizePath::metrics_h_metric);
  local_68 = path->_M_string_length;
  if (local_68 == 0) {
    path_00 = (char *)0x0;
  }
  else {
    path_00 = (path->_M_dataplus)._M_p;
  }
  bVar1 = CanonicalizePath(path_00,&local_68,slash_bits,err);
  if (bVar1) {
    std::__cxx11::string::resize((ulong)path,(char)local_68);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar1;
}

Assistant:

bool CanonicalizePath(string* path, uint64_t* slash_bits, string* err) {
  METRIC_RECORD("canonicalize str");
  size_t len = path->size();
  char* str = 0;
  if (len > 0)
    str = &(*path)[0];
  if (!CanonicalizePath(str, &len, slash_bits, err))
    return false;
  path->resize(len);
  return true;
}